

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenSwitchSetNameAt(BinaryenExpressionRef expr,BinaryenIndex index,char *name)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  Name *this;
  Name local_38;
  BinaryenExpressionRef local_28;
  Expression *expression;
  char *name_local;
  BinaryenExpressionRef pEStack_10;
  BinaryenIndex index_local;
  BinaryenExpressionRef expr_local;
  
  local_28 = expr;
  expression = (Expression *)name;
  name_local._4_4_ = index;
  pEStack_10 = expr;
  bVar1 = wasm::Expression::is<wasm::Switch>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Switch>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x86e,
                  "void BinaryenSwitchSetNameAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  uVar2 = (ulong)name_local._4_4_;
  sVar3 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                    ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(local_28 + 1));
  if (uVar2 < sVar3) {
    if (expression != (Expression *)0x0) {
      wasm::Name::Name(&local_38,(char *)expression);
      this = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(local_28 + 1),
                        (ulong)name_local._4_4_);
      wasm::Name::operator=(this,&local_38);
      return;
    }
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x870,
                  "void BinaryenSwitchSetNameAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  __assert_fail("index < static_cast<Switch*>(expression)->targets.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x86f,
                "void BinaryenSwitchSetNameAt(BinaryenExpressionRef, BinaryenIndex, const char *)");
}

Assistant:

void BinaryenSwitchSetNameAt(BinaryenExpressionRef expr,
                             BinaryenIndex index,
                             const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Switch>());
  assert(index < static_cast<Switch*>(expression)->targets.size());
  assert(name);
  static_cast<Switch*>(expression)->targets[index] = name;
}